

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

qpTestResult __thiscall
gl4cts::ClipControlViewportBounds::ValidateFramebuffer
          (ClipControlViewportBounds *this,Context *context,GLenum origin)

{
  float y_00;
  bool bVar1;
  int iVar2;
  int width;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  float fVar4;
  float fVar5;
  bool local_e6;
  bool local_e5;
  PixelBufferAccess local_d0;
  deUint32 local_a8;
  deUint32 local_a4;
  deUint32 local_a0;
  bool local_99;
  float local_98;
  float fStack_94;
  bool greenQuadrant;
  float xVPCoord;
  float xCoord;
  int x;
  float yVPCoord;
  float yCoord;
  int y;
  TestLog *log;
  undefined1 local_68 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  GLuint windowH;
  GLuint windowW;
  RenderTarget *renderTarget;
  GLenum origin_local;
  Context *context_local;
  ClipControlViewportBounds *this_local;
  
  pRVar3 = deqp::Context::getRenderContext(context);
  iVar2 = (*pRVar3->_vptr_RenderContext[4])();
  width = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar2));
  iVar2 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var,iVar2));
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,width,iVar2);
  tcu::Surface::Surface((Surface *)local_68,width,iVar2);
  this_00 = deqp::Context::getTestContext(context);
  _yCoord = tcu::TestContext::getLog(this_00);
  for (yVPCoord = 0.0; fVar4 = yVPCoord,
      iVar2 = tcu::Surface::getHeight((Surface *)&referenceFrame.m_pixels.m_cap), (int)fVar4 < iVar2
      ; yVPCoord = (float)((int)yVPCoord + 1)) {
    fVar4 = (float)(int)yVPCoord;
    iVar2 = tcu::Surface::getHeight((Surface *)&referenceFrame.m_pixels.m_cap);
    x = (int)(fVar4 / (float)iVar2);
    xCoord = ((float)x - 0.25) * 4.0;
    for (xVPCoord = 0.0; fVar4 = xVPCoord,
        iVar2 = tcu::Surface::getWidth((Surface *)&referenceFrame.m_pixels.m_cap),
        (int)fVar4 < iVar2; xVPCoord = (float)((int)xVPCoord + 1)) {
      fVar5 = (float)(int)xVPCoord;
      iVar2 = tcu::Surface::getWidth((Surface *)&referenceFrame.m_pixels.m_cap);
      y_00 = yVPCoord;
      fVar4 = xVPCoord;
      fStack_94 = fVar5 / (float)iVar2;
      local_98 = (fStack_94 - 0.125) * 2.0;
      if ((((local_98 <= 0.0) || (1.0 <= local_98)) || (xCoord <= 0.0)) || (1.0 <= xCoord)) {
        local_a8 = (deUint32)tcu::RGBA::blue();
        tcu::Surface::setPixel((Surface *)local_68,(int)fVar4,(int)y_00,(RGBA)local_a8);
      }
      else {
        if (origin == 0x8ca2) {
          local_e5 = 0.5 < xCoord && local_98 <= 0.5;
          local_99 = local_e5;
        }
        else {
          local_e6 = xCoord <= 0.5 && local_98 <= 0.5;
          local_99 = local_e6;
        }
        if (local_99 == false) {
          local_a4 = (deUint32)tcu::RGBA::red();
          tcu::Surface::setPixel((Surface *)local_68,(int)fVar4,(int)y_00,(RGBA)local_a4);
        }
        else {
          local_a0 = (deUint32)tcu::RGBA::green();
          tcu::Surface::setPixel((Surface *)local_68,(int)fVar4,(int)y_00,(RGBA)local_a0);
        }
      }
    }
  }
  pRVar3 = deqp::Context::getRenderContext(context);
  tcu::Surface::getAccess(&local_d0,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar3,0,0,&local_d0);
  bVar1 = tcu::fuzzyCompare(_yCoord,"Result","Image comparison result",(Surface *)local_68,
                            (Surface *)&referenceFrame.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
  this_local._4_4_ = (qpTestResult)!bVar1;
  tcu::Surface::~Surface((Surface *)local_68);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return this_local._4_4_;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context, glw::GLenum origin)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 windowW	  = renderTarget.getWidth();
		glw::GLuint				 windowH	  = renderTarget.getHeight();
		tcu::Surface			 renderedFrame(windowW, windowH);
		tcu::Surface			 referenceFrame(windowW, windowH);

		tcu::TestLog& log = context.getTestContext().getLog();

		for (int y = 0; y < renderedFrame.getHeight(); y++)
		{
			float yCoord   = (float)(y) / (float)renderedFrame.getHeight();
			float yVPCoord = (yCoord - 0.25f) * 4.0f;

			for (int x = 0; x < renderedFrame.getWidth(); x++)
			{
				float xCoord   = (float)(x) / (float)renderedFrame.getWidth();
				float xVPCoord = (xCoord - 0.125f) * 2.0f;

				if (xVPCoord > 0.0f && xVPCoord < 1.0f && yVPCoord > 0.0f && yVPCoord < 1.0f)
				{

					bool greenQuadrant;

					//inside viewport
					if (origin == GL_UPPER_LEFT)
					{
						greenQuadrant = (yVPCoord > 0.5f && xVPCoord <= 0.5f);
					}
					else
					{
						greenQuadrant = (yVPCoord <= 0.5f && xVPCoord <= 0.5f);
					}

					if (greenQuadrant)
					{
						referenceFrame.setPixel(x, y, tcu::RGBA::green());
					}
					else
					{
						referenceFrame.setPixel(x, y, tcu::RGBA::red());
					}
				}
				else
				{
					//outside viewport
					referenceFrame.setPixel(x, y, tcu::RGBA::blue());
				}
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		if (tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f,
							  tcu::COMPARE_LOG_RESULT))
		{
			return QP_TEST_RESULT_PASS;
		}
		else
		{
			return QP_TEST_RESULT_FAIL;
		}
	}